

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function_catalog_entry.cpp
# Opt level: O0

void __thiscall
duckdb::ScalarFunctionCatalogEntry::ScalarFunctionCatalogEntry
          (ScalarFunctionCatalogEntry *this,Catalog *catalog,SchemaCatalogEntry *schema,
          CreateScalarFunctionInfo *info)

{
  ScalarFunctionSet *in_RDI;
  SchemaCatalogEntry *in_stack_00000038;
  Catalog *in_stack_00000040;
  CatalogType in_stack_0000004f;
  FunctionEntry *in_stack_00000050;
  ScalarFunctionSet *in_stack_ffffffffffffffd0;
  
  FunctionEntry::FunctionEntry
            (in_stack_00000050,in_stack_0000004f,in_stack_00000040,in_stack_00000038,
             (CreateFunctionInfo *)this);
  *(undefined ***)&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).name =
       &PTR__ScalarFunctionCatalogEntry_0351f3f8;
  ScalarFunctionSet::ScalarFunctionSet(in_stack_ffffffffffffffd0,in_RDI);
  return;
}

Assistant:

ScalarFunctionCatalogEntry::ScalarFunctionCatalogEntry(Catalog &catalog, SchemaCatalogEntry &schema,
                                                       CreateScalarFunctionInfo &info)
    : FunctionEntry(CatalogType::SCALAR_FUNCTION_ENTRY, catalog, schema, info), functions(info.functions) {
}